

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  anon_class_56_7_5b6a6b8a onRead;
  anon_class_32_4_c05b0960 onFinish;
  bool bVar1;
  int fd;
  char *pcVar2;
  reference pbVar3;
  cmUVProcessChainBuilder *this_00;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  ostream *poVar4;
  undefined8 uVar5;
  void *pvVar6;
  ulong uVar7;
  rep_conflict rVar8;
  undefined1 auVar9 [16];
  string local_1048 [32];
  undefined1 local_1028 [8];
  ostringstream cmCTestLog_msg_8;
  string local_eb0 [32];
  undefined1 local_e90 [8];
  ostringstream cmCTestLog_msg_7;
  string local_d18 [32];
  undefined1 local_cf8 [8];
  ostringstream cmCTestLog_msg_6;
  string local_b80 [32];
  undefined1 local_b60 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_9e8 [8];
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  Status *status;
  undefined1 local_998 [8];
  ostringstream cmCTestLog_msg_4;
  bool finished;
  undefined1 local_7c0 [8];
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  undefined1 local_798 [8];
  ostringstream cmCTestLog_msg_3;
  cmProcessOutput local_619;
  undefined8 uStack_618;
  cmProcessOutput processOutput;
  size_type tick_line_len;
  size_type tick_len;
  size_type tick;
  uv_pipe_ptr outputStream;
  cmUVProcessChain chain;
  string local_5e0;
  undefined1 local_5c0 [8];
  cmUVProcessChainBuilder builder;
  ostringstream local_540 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  ostringstream cmCTestLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1e0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostream *ofs_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  string *command_local;
  cmCTest *this_local;
  cmDuration timeout_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ofs;
  this_local = (cmCTest *)timeout.__r;
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,command);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
  if (bVar1) {
    timeout_local.__r._7_1_ = 0;
  }
  else {
    std::__cxx11::string::clear();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::operator<<((ostream *)local_1e0,"Run command:");
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x444,pcVar2,false);
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60);
    arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar1) break;
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar4 = std::operator<<((ostream *)local_3a8," \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar3);
      std::operator<<(poVar4,"\"");
      std::__cxx11::ostringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x446,pcVar2,false);
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::ostringstream(local_540);
    std::ostream::operator<<(local_540,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x448,pcVar2,false);
    std::__cxx11::string::~string((string *)&builder.Loop);
    std::__cxx11::ostringstream::~ostringstream(local_540);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_5c0);
    this_00 = cmUVProcessChainBuilder::AddCommand
                        ((cmUVProcessChainBuilder *)local_5c0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_60);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    if (dir != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,dir,
                 (allocator<char> *)
                 ((long)&chain.Data._M_t.
                         super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                         .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
      cmUVProcessChainBuilder::SetWorkingDirectory((cmUVProcessChainBuilder *)local_5c0,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&chain.Data._M_t.
                         super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                         .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    }
    cmUVProcessChainBuilder::Start
              ((cmUVProcessChainBuilder *)
               &outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)&tick);
    ctx = cmUVProcessChain::GetLoop
                    ((cmUVProcessChain *)
                     &outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                      super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                      super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&tick,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_ *)&tick);
    fd = cmUVProcessChain::OutputStream
                   ((cmUVProcessChain *)
                    &outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                     super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                     super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uv_pipe_open(handle,fd);
    tick_len = 0;
    tick_line_len = 0x400;
    uStack_618 = 0x32;
    cmProcessOutput::cmProcessOutput(&local_619,encoding,0x400);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
    poVar4 = std::operator<<((ostream *)local_798,"   Each . represents ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,tick_line_len);
    poVar4 = std::operator<<(poVar4," bytes of output\n    ");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x45f,pcVar2,false);
    std::__cxx11::string::~string((string *)&outputHandle);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
    ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&tick);
    onRead.processOutput = &local_619;
    onRead.this = this;
    onRead.output = output;
    onRead.tick = &tick_len;
    onRead.tick_len = &tick_line_len;
    onRead.tick_line_len = &stack0xfffffffffffff9e8;
    onRead.ofs = (ostream *)
                 args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    onFinish.processOutput = &local_619;
    onFinish.this = this;
    onFinish.output = output;
    onFinish.ofs = (ostream *)
                   args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cmUVStreamRead<cmCTest::RunMakeCommand(std::__cxx11::string_const&,std::__cxx11::string&,int*,char_const*,std::chrono::duration<double,std::ratio<1l,1l>>,std::ostream&,cmProcessOutput::Encoding)::__0,cmCTest::RunMakeCommand(std::__cxx11::string_const&,std::__cxx11::string&,int*,char_const*,std::chrono::duration<double,std::ratio<1l,1l>>,std::ostream&,cmProcessOutput::Encoding)::__1>
              ((uv_stream_t *)local_7c0,onRead,onFinish);
    rVar8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                      ((duration<double,_std::ratio<1L,_1L>_> *)&this_local);
    uVar7 = (ulong)(rVar8 * 1000.0);
    bVar1 = cmUVProcessChain::Wait
                      ((cmUVProcessChain *)
                       &outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                        super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                        super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       uVar7 | (long)(rVar8 * 1000.0 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
    poVar4 = std::operator<<((ostream *)local_998," Size of output: ");
    uVar5 = std::__cxx11::string::size();
    auVar9._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = 0x45300000;
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(int)(((auVar9._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))
                                    * 0.0009765625));
    poVar4 = std::operator<<(poVar4,"K");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x48b,pcVar2,false);
    std::__cxx11::string::~string((string *)&status);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
    if (bVar1) {
      exception.second.field_2._8_8_ =
           cmUVProcessChain::GetStatus
                     ((cmUVProcessChain *)
                      &outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                       super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                       super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_9e8,(Status *)exception.second.field_2._8_8_);
      if (local_9e8._0_4_ == None) {
        *retVal = (int)*(undefined8 *)(exception.second.field_2._8_8_ + 8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b60);
        poVar4 = std::operator<<((ostream *)local_b60,"Command exited with the value: ");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,*retVal);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x494,pcVar2,false);
        std::__cxx11::string::~string(local_b80);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b60);
      }
      else if (local_9e8._0_4_ == Spawn) {
        std::__cxx11::string::operator+=((string *)output,"\n*** ERROR executing: ");
        std::__cxx11::string::operator+=((string *)output,(string *)&exception);
        std::__cxx11::string::operator+=((string *)output,"\n***The build process failed.");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cf8);
        poVar4 = std::operator<<((ostream *)local_cf8,"There was an error: ");
        poVar4 = std::operator<<(poVar4,(string *)&exception);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x49b,pcVar2,false);
        std::__cxx11::string::~string(local_d18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cf8);
      }
      else {
        *retVal = local_9e8._0_4_;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
        poVar4 = std::operator<<((ostream *)local_e90,"There was an exception: ");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,*retVal);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x4a0,pcVar2,false);
        std::__cxx11::string::~string(local_eb0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
      }
      std::
      pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_9e8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1028);
      poVar4 = std::operator<<((ostream *)local_1028,"There was a timeout");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4a4,pcVar2,false);
      std::__cxx11::string::~string(local_1048);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1028);
    }
    timeout_local.__r._7_1_ = 1;
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               local_7c0);
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)&tick);
    cmUVProcessChain::~cmUVProcessChain
              ((cmUVProcessChain *)
               &outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_5c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (bool)(timeout_local.__r._7_1_ & 1);
}

Assistant:

bool cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                             int* retVal, const char* dir, cmDuration timeout,
                             std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (auto const& arg : args) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args).SetMergedBuiltinStreams();
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  cmProcessOutput processOutput(encoding);
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tick, &tick_len, &tick_line_len,
     &ofs](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      for (char& cc : strdata) {
        if (cc == 0) {
          cc = '\n';
        }
      }
      output.append(strdata);
      while (output.size() > (tick * tick_len)) {
        tick++;
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
        if (tick % tick_line_len == 0 && tick > 0) {
          cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                     "  Size: " << int((double(output.size()) / 1024.0) + 1)
                                << "K\n    " << std::flush);
        }
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (ofs) {
        ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &output, &ofs]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        output.append(strdata);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (ofs) {
          ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
        }
      }
    });

  bool finished = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  if (finished) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   "Command exited with the value: " << *retVal << std::endl);
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        output += "\n*** ERROR executing: ";
        output += exception.second;
        output += "\n***The build process failed.";
        cmCTestLog(this, ERROR_MESSAGE,
                   "There was an error: " << exception.second << std::endl);
        break;
      default:
        *retVal = static_cast<int>(exception.first);
        cmCTestLog(this, WARNING,
                   "There was an exception: " << *retVal << std::endl);
        break;
    }
  } else {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  }

  return true;
}